

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
                   (string *__return_storage_ptr__,
                   basic_string_view<char,_std::char_traits<char>_> *a,
                   basic_string_view<char,_std::char_traits<char>_> *b,
                   basic_string_view<char,_std::char_traits<char>_> *args)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view view;
  string_view view_00;
  cmAlphaNum local_148;
  size_t local_110;
  char *local_108;
  cmAlphaNum local_100;
  size_t local_c8;
  char *local_c0;
  cmAlphaNum local_b8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_80;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_68;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_50;
  iterator local_38;
  undefined8 local_30;
  string_view *local_28;
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  basic_string_view<char,_std::char_traits<char>_> *b_local;
  basic_string_view<char,_std::char_traits<char>_> *a_local;
  
  local_c8 = a->_M_len;
  local_c0 = a->_M_str;
  view._M_len = a->_M_len;
  view._M_str = a->_M_str;
  local_28 = args;
  args_local = b;
  b_local = a;
  a_local = (basic_string_view<char,_std::char_traits<char>_> *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_b8,view);
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>(std::basic_string_view<char,std::char_traits<char>>&&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_80,
             &cmStrCat<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>(std::basic_string_view<char,std::char_traits<char>>&&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&&)
              ::makePair,&local_b8);
  local_110 = args_local->_M_len;
  local_108 = args_local->_M_str;
  view_00._M_len = args_local->_M_len;
  view_00._M_str = args_local->_M_str;
  cmAlphaNum::cmAlphaNum(&local_100,view_00);
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>(std::basic_string_view<char,std::char_traits<char>>&&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_68,
             &cmStrCat<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>(std::basic_string_view<char,std::char_traits<char>>&&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&&)
              ::makePair,&local_100);
  cmAlphaNum::cmAlphaNum(&local_148,*local_28);
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>(std::basic_string_view<char,std::char_traits<char>>&&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_50,
             &cmStrCat<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>(std::basic_string_view<char,std::char_traits<char>>&&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&&)
              ::makePair,&local_148);
  local_38 = &local_80;
  local_30 = 3;
  views._M_len = 3;
  views._M_array = local_38;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}